

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::AlternativePass1
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this)

{
  bool *deferredLiteralNode_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  Node *pNVar4;
  undefined4 *puVar5;
  ConcatNode *pCVar6;
  ConcatNode *pCVar7;
  ConcatNode *this_00;
  undefined1 local_d8 [8];
  MatchCharNode deferredCharNode;
  MatchLiteralNode deferredLiteralNode;
  ConcatNode *local_40;
  bool local_31 [8];
  bool previousSurrogatePart;
  
  bVar2 = IsEndOfAlternative(this);
  if (bVar2) {
    pNVar4 = (Node *)new<Memory::ArenaAllocator>(0x38,this->ctAllocator,0x35916e);
    SimpleNode::SimpleNode((SimpleNode *)pNVar4,Empty);
    return pNVar4;
  }
  MatchCharNode::MatchCharNode((MatchCharNode *)local_d8,L'\0');
  MatchLiteralNode::MatchLiteralNode((MatchLiteralNode *)&deferredCharNode.isEquivClass,0,0);
  local_31[0] = false;
  local_40 = (ConcatNode *)TermPass1(this,(MatchCharNode *)local_d8,local_31);
  if (local_40 == (ConcatNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x389,"(node != nullptr)","node != nullptr");
    if (!bVar2) goto LAB_00d1c52f;
    *puVar5 = 0;
  }
  pCVar6 = local_40;
  if ((local_40->super_Node).tag == Concat) {
    do {
      pCVar7 = pCVar6;
      pCVar6 = pCVar7->tail;
    } while (pCVar7->tail != (ConcatNode *)0x0);
    iVar3 = (**pCVar7->head->_vptr_Node)();
    if (iVar3 != 0) {
      AccumLiteral(this,(MatchLiteralNode *)&deferredCharNode.isEquivClass,pCVar7->head);
      pCVar7->head = (Node *)&deferredCharNode.isEquivClass;
    }
  }
  else {
    iVar3 = (**(local_40->super_Node)._vptr_Node)(local_40);
    if (iVar3 == 0) {
      pCVar7 = (ConcatNode *)0x0;
    }
    else {
      AccumLiteral(this,(MatchLiteralNode *)&deferredCharNode.isEquivClass,(Node *)local_40);
      pCVar7 = (ConcatNode *)0x0;
      local_40 = (ConcatNode *)&deferredCharNode.isEquivClass;
    }
  }
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
LAB_00d1c09e:
  bVar2 = IsEndOfAlternative(this);
  if (bVar2) goto LAB_00d1c49d;
  pCVar6 = (ConcatNode *)TermPass1(this,(MatchCharNode *)local_d8,local_31);
  deferredLiteralNode_00 = &deferredCharNode.isEquivClass;
  if (pCVar6 == (ConcatNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x3a9,"(next != nullptr)","next != nullptr");
    if (!bVar2) goto LAB_00d1c52f;
    *puVar5 = 0;
  }
  iVar3 = (**(pCVar6->super_Node)._vptr_Node)(pCVar6);
  if (iVar3 != 0) {
    AccumLiteral(this,(MatchLiteralNode *)deferredLiteralNode_00,(Node *)pCVar6);
    if (pCVar7 == (ConcatNode *)0x0) {
      pCVar7 = (ConcatNode *)0x0;
      if (local_40 != (ConcatNode *)deferredLiteralNode_00) {
        pCVar7 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
        ConcatNode::ConcatNode(pCVar7,(Node *)&deferredCharNode.isEquivClass,(ConcatNode *)0x0);
        pCVar6 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
        ConcatNode::ConcatNode(pCVar6,&local_40->super_Node,pCVar7);
        local_40 = pCVar6;
      }
    }
    else if (pCVar7->head != (Node *)deferredLiteralNode_00) {
      pCVar6 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
      ConcatNode::ConcatNode(pCVar6,(Node *)&deferredCharNode.isEquivClass,(ConcatNode *)0x0);
      pCVar7->tail = pCVar6;
      pCVar7 = pCVar6;
    }
    goto LAB_00d1c09e;
  }
  if ((pCVar6->super_Node).tag != Concat) {
    this_00 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
    ConcatNode::ConcatNode(this_00,(Node *)pCVar6,(ConcatNode *)0x0);
    if (pCVar7 == (ConcatNode *)0x0) {
      pCVar6 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
      pNVar4 = FinalTerm(this,&local_40->super_Node,
                         (MatchLiteralNode *)&deferredCharNode.isEquivClass);
      ConcatNode::ConcatNode(pCVar6,pNVar4,this_00);
      local_40 = pCVar6;
    }
    else {
      pNVar4 = FinalTerm(this,pCVar7->head,(MatchLiteralNode *)&deferredCharNode.isEquivClass);
      pCVar7->head = pNVar4;
      pCVar7->tail = this_00;
    }
    pCVar7 = this_00;
    if (deferredLiteralNode.super_Node.followConsumes.upper != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x3fe,"(deferredLiteralNode.length == 0)",
                         "deferredLiteralNode.length == 0");
      if (!bVar2) goto LAB_00d1c52f;
      *puVar5 = 0;
    }
    goto LAB_00d1c09e;
  }
  iVar3 = (**pCVar6->head->_vptr_Node)();
  if (iVar3 != 0) {
    if ((pCVar7 != (ConcatNode *)0x0) || (local_40 != (ConcatNode *)deferredLiteralNode_00)) {
      if (pCVar7 == (ConcatNode *)0x0) goto LAB_00d1c3ea;
      pNVar4 = pCVar7->head;
      if (pNVar4 == (Node *)deferredLiteralNode_00) goto LAB_00d1c1aa;
LAB_00d1c3cb:
      pNVar4 = FinalTerm(this,pNVar4,(MatchLiteralNode *)deferredLiteralNode_00);
      pCVar7->head = pNVar4;
      pCVar7->tail = pCVar6;
      goto LAB_00d1c419;
    }
LAB_00d1c1aa:
    AccumLiteral(this,(MatchLiteralNode *)deferredLiteralNode_00,pCVar6->head);
    pCVar6 = pCVar6->tail;
    if (pCVar6 == (ConcatNode *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x3d2,"(nextList != 0)","nextList != 0");
      if (!bVar2) goto LAB_00d1c52f;
      *puVar5 = 0;
    }
    iVar3 = (**pCVar6->head->_vptr_Node)();
    if (iVar3 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x3d4,"(nextList->head->LiteralLength() == 0)",
                         "nextList->head->LiteralLength() == 0");
      if (bVar2) {
        *puVar5 = 0;
        goto LAB_00d1c253;
      }
      goto LAB_00d1c52f;
    }
  }
LAB_00d1c253:
  if (pCVar7 != (ConcatNode *)0x0) {
    pNVar4 = pCVar7->head;
    goto LAB_00d1c3cb;
  }
LAB_00d1c3ea:
  pCVar7 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
  pNVar4 = FinalTerm(this,&local_40->super_Node,(MatchLiteralNode *)deferredLiteralNode_00);
  ConcatNode::ConcatNode(pCVar7,pNVar4,pCVar6);
  local_40 = pCVar7;
LAB_00d1c419:
  do {
    pCVar7 = pCVar6;
    pCVar6 = pCVar7->tail;
  } while (pCVar7->tail != (ConcatNode *)0x0);
  if (deferredLiteralNode.super_Node.followConsumes.upper != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x3e5,"(deferredLiteralNode.length == 0)","deferredLiteralNode.length == 0")
    ;
    if (!bVar2) goto LAB_00d1c52f;
    *puVar5 = 0;
  }
  iVar3 = (**pCVar7->head->_vptr_Node)();
  if (iVar3 != 0) {
    AccumLiteral(this,(MatchLiteralNode *)&deferredCharNode.isEquivClass,pCVar7->head);
    pCVar7->head = (Node *)&deferredCharNode.isEquivClass;
  }
  goto LAB_00d1c09e;
LAB_00d1c49d:
  if (pCVar7 == (ConcatNode *)0x0) {
    local_40 = (ConcatNode *)
               FinalTerm(this,&local_40->super_Node,
                         (MatchLiteralNode *)&deferredCharNode.isEquivClass);
  }
  else {
    pNVar4 = FinalTerm(this,pCVar7->head,(MatchLiteralNode *)&deferredCharNode.isEquivClass);
    pCVar7->head = pNVar4;
  }
  if (deferredLiteralNode.super_Node.followConsumes.upper != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x406,"(deferredLiteralNode.length == 0)","deferredLiteralNode.length == 0")
    ;
    if (!bVar2) {
LAB_00d1c52f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return &local_40->super_Node;
}

Assistant:

Node* Parser<P, IsLiteral>::AlternativePass1()
    {
        if (IsEndOfAlternative())
            return Anew(ctAllocator, SimpleNode, Node::Empty);

        MatchCharNode deferredCharNode(0);
        MatchLiteralNode deferredLiteralNode(0, 0);

        // Maintain the invariants:
        //  - concat lists have two or more items
        //  - concat list items are never concat lists
        //  - a concat list never contains two consecutive match-character/match-literal nodes
        bool previousSurrogatePart = false;
        Node* node = TermPass1(&deferredCharNode, previousSurrogatePart);
        AnalysisAssert(node != nullptr);
        ConcatNode* last = 0;
        // First node may be a concat
        if (node->tag == Node::Concat)
        {
            last = (ConcatNode*)node;
            while (last->tail != 0)
                last = last->tail;
        }

        if (last == 0)
        {
            if (node->LiteralLength() > 0)
            {
                // Begin a new literal
                AccumLiteral(&deferredLiteralNode, node);
                node = &deferredLiteralNode;
            }
        }
        else
        {
            if (last->head->LiteralLength() > 0)
            {
                // Begin a new literal
                AccumLiteral(&deferredLiteralNode, last->head);
                last->head = &deferredLiteralNode;
            }
        }

        while (!IsEndOfAlternative())
        {
            Node* next = TermPass1(&deferredCharNode, previousSurrogatePart);
            AnalysisAssert(next != nullptr);
            if (next->LiteralLength() > 0)
            {
                // Begin a new literal or grow the existing literal
                AccumLiteral(&deferredLiteralNode, next);
                if (last == 0)
                {
                    if (node != &deferredLiteralNode)
                    {
                        // So far we have first item and the current literal
                        ConcatNode* cons = Anew(ctAllocator, ConcatNode, &deferredLiteralNode, 0);
                        node = Anew(ctAllocator, ConcatNode, node, cons);
                        last = cons;
                    }
                    // else: keep growing first literal
                }
                else
                {
                    if (last->head != &deferredLiteralNode)
                    {
                        // Append a new literal node
                        ConcatNode* cons = Anew(ctAllocator, ConcatNode, &deferredLiteralNode, 0);
                        last->tail = cons;
                        last = cons;
                    }
                    // else: keep growing current literal
                }
            }
            else if (next->tag == Node::Concat)
            {
                // Append this list to accumulated list
                ConcatNode* nextList = (ConcatNode*)next;
                if (nextList->head->LiteralLength() > 0 &&
                    ((last == 0 && node == &deferredLiteralNode) ||
                     (last != 0 && last->head == &deferredLiteralNode)))
                {
                    // Absorb the next character or literal into the current literal
                    // (may leave a gab in litbuf)
                    AccumLiteral(&deferredLiteralNode, nextList->head);
                    nextList = nextList->tail;
                    // List has at least two items
                    AnalysisAssert(nextList != 0);
                    // List should be in canonical form, so no consecutive chars/literals
                    Assert(nextList->head->LiteralLength() == 0);
                }
                if (last == 0)
                    node = Anew(ctAllocator, ConcatNode, FinalTerm(node, &deferredLiteralNode), nextList);
                else
                {
                    last->head = FinalTerm(last->head, &deferredLiteralNode);
                    last->tail = nextList;
                }
                // NextList can't be nullptr, since it was last set as next, which
                // was dereferenced, or it was set on a path that already has this
                // analysis assert.
                AnalysisAssert(nextList != nullptr);
                while (nextList->tail != 0)
                    nextList = nextList->tail;
                last = nextList;
                // No outstanding literals
                Assert(deferredLiteralNode.length == 0);
                // We just set this from nextList, which we know is not nullptr.
                AnalysisAssert(last != nullptr);
                if (last->head->LiteralLength() > 0)
                {
                    // If the list ends with a literal, transfer it into deferredLiteralNode
                    // so we can continue accumulating (won't leave a gab in litbuf)
                    AccumLiteral(&deferredLiteralNode, last->head);
                    // Can discard MatchLiteralNode since it lives in compile-time allocator
                    last->head = &deferredLiteralNode;
                }
            }
            else
            {
                // Append this node to accumulated list
                ConcatNode* cons = Anew(ctAllocator, ConcatNode, next, 0);
                if (last == 0)
                    node = Anew(ctAllocator, ConcatNode, FinalTerm(node, &deferredLiteralNode), cons);
                else
                {
                    last->head = FinalTerm(last->head, &deferredLiteralNode);
                    last->tail = cons;
                }
                last = cons;
                // No outstanding literals
                Assert(deferredLiteralNode.length == 0);
            }
        }
        if (last == 0)
            node = FinalTerm(node, &deferredLiteralNode);
        else
            last->head = FinalTerm(last->head, &deferredLiteralNode);
        // No outstanding literals
        Assert(deferredLiteralNode.length == 0);

        return node;
    }